

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

int x64SAL(uchar *stream,x86Reg reg,int num)

{
  uchar *start;
  
  if ((char)(uchar)num == num) {
    *stream = 8 < (int)reg | 0x48;
    stream[1] = 0xc1;
    stream[2] = regCode[reg] | 0xe0;
    stream[3] = (uchar)num;
    return 4;
  }
  __assert_fail("char(num) == num",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                ,0x66e,"int x64SAL(unsigned char *, x86Reg, int)");
}

Assistant:

int x64SAL(unsigned char *stream, x86Reg reg, int num)
{
	unsigned char *start = stream;

	assert(char(num) == num);

	stream += encodeRex(stream, true, rNONE, rNONE, reg);
	*stream++ = 0xc1;
	*stream++ = encodeRegister(reg, 4);
	stream += encodeImmByte(stream, (char)num);

	return int(stream - start);
}